

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

Symbol comment_type(Env *env)

{
  State *pSVar1;
  uint32_t uVar2;
  _Bool _Var3;
  uint uVar4;
  TSLexer *pTVar5;
  uint32_t rel;
  
  uVar2 = 2;
  do {
    rel = uVar2;
    pSVar1 = env->state;
    uVar4 = (pSVar1->lookahead).offset + rel;
    if (uVar4 < (pSVar1->lookahead).size) {
      pTVar5 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
    }
    else {
      advance_before(env,rel);
      pTVar5 = env->lexer;
    }
    uVar2 = rel + 1;
  } while (pTVar5->lookahead == 0x2d);
  while( true ) {
    _Var3 = (*env->lexer->eof)(env->lexer);
    if (_Var3) {
      return COMMENT;
    }
    pSVar1 = env->state;
    uVar4 = (pSVar1->lookahead).offset + rel;
    if (uVar4 < (pSVar1->lookahead).size) {
      pTVar5 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
    }
    else {
      advance_before(env,rel);
      pTVar5 = env->lexer;
    }
    uVar4 = pTVar5->lookahead;
    if (uVar4 == 0x5e) {
      return HADDOCK;
    }
    if (uVar4 == 0x7c) {
      return HADDOCK;
    }
    if (uVar4 - 0x3001 < 0xffffd01f) break;
    rel = rel + 1;
    if (("\x01"[uVar4 - 0x20 >> 3] >> (uVar4 & 7) & 1) == 0) {
      return COMMENT;
    }
  }
  return COMMENT;
}

Assistant:

static Symbol comment_type(Env *env) {
  uint32_t i = 2;
  while (peek(env, i) == '-') i++;
  while (not_eof(env)) {
    int32_t c = peek(env, i++);
    if (c == '|' || c == '^') return HADDOCK;
    else if (!is_space_char(c)) break;
  }
  return COMMENT;
}